

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Macintosh.cpp
# Opt level: O2

uint8_t __thiscall
Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler::
get_port_input(VIAPortHandler *this,Port port)

{
  byte bVar1;
  __int_type_conflict _Var2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QuadratureMouse *pQVar7;
  bool bVar8;
  
  if (port == A) {
    return '\0';
  }
  if (port == B) {
    _Var2 = (this->mouse_->button_flags_).super___atomic_base<int>._M_i;
    pQVar7 = this->mouse_;
    iVar3 = pQVar7->secondaries_[0];
    iVar4 = pQVar7->primaries_[0];
    iVar5 = pQVar7->primaries_[1];
    iVar6 = pQVar7->secondaries_[1];
    bVar1 = this->clock_->result_;
    bVar8 = video_is_outputting(this->machine_);
    return (!bVar8 << 6 |
           bVar1 >> 6 & 2 |
           ((byte)(iVar5 << 4) | (byte)(iVar6 << 5)) & 0x20 |
           (((byte)(iVar4 << 3) | (byte)(iVar3 << 4)) & 0x10) + ((byte)_Var2 & 1) * '\b') ^ 8;
  }
  return 0xff;
}

Assistant:

uint8_t get_port_input(Port port) {
					switch(port) {
						case Port::A:
//							printf("6522 r A\n");
						return 0x00;	// TODO: b7 = SCC wait/request

						case Port::B:
						return uint8_t(
							((mouse_.get_button_mask() & 1) ? 0x00 : 0x08) |
							((mouse_.get_channel(0) & 2) << 3) |
							((mouse_.get_channel(1) & 2) << 4) |
							(clock_.get_data() ? 0x02 : 0x00) |
							(machine_.video_is_outputting() ? 0x00 : 0x40)
						);
					}

					// Should be unreachable.
					return 0xff;
				}